

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O0

void __thiscall nigel::IM_Operator::~IM_Operator(IM_Operator *this)

{
  IM_Operator *this_local;
  
  ~IM_Operator(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

virtual ~IM_Operator() {}